

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_af2fbe::UsageRequirementProperty::Write<cmValue>
          (UsageRequirementProperty *this,cmTargetInternals *impl,optional<cmListFileBacktrace> *bt,
          string *prop,cmValue value,Action action)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  bVar1 = std::operator==(__x,(this->Name).super_string_view);
  if (bVar1) {
    WriteDirect<cmValue>(this,impl,bt,value,action);
  }
  return bVar1;
}

Assistant:

bool UsageRequirementProperty::Write(
  cmTargetInternals const* impl, cm::optional<cmListFileBacktrace> const& bt,
  const std::string& prop, ValueType value, Action action)
{
  if (prop == this->Name) {
    this->WriteDirect(impl, bt, value, action);
    return true;
  }
  return false;
}